

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O0

OldToNew __thiscall
wasm::Debug::LocationUpdater::getCompileUnitBasesForLoc(LocationUpdater *this,size_t offset)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  pointer pvVar4;
  int local_58 [2];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
  local_50;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
  local_48;
  const_iterator iter;
  mapped_type local_38;
  mapped_type index;
  int local_28;
  key_type local_24;
  size_t local_20;
  size_t offset_local;
  LocationUpdater *this_local;
  
  local_24 = (key_type)offset;
  local_20 = offset;
  offset_local = (size_t)this;
  sVar2 = std::
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::count(&this->locToUnitMap,&local_24);
  if (sVar2 == 0) {
    local_28 = 0;
    index._4_4_ = 0;
    std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
              ((pair<unsigned_int,_unsigned_int> *)&this_local,&local_28,(int *)((long)&index + 4));
  }
  else {
    iter.
    super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
    ._M_cur._4_4_ = (undefined4)local_20;
    pmVar3 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::at(&this->locToUnitMap,
                  (key_type *)
                  ((long)&iter.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
                          ._M_cur + 4));
    local_38 = *pmVar3;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::pair<unsigned_int,_unsigned_int>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::find(&this->compileUnitBases,&local_38);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::pair<unsigned_int,_unsigned_int>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>_>
         ::end(&this->compileUnitBases);
    bVar1 = std::__detail::operator!=(&local_48,&local_50);
    if (bVar1) {
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false,_false>
                             *)&local_48);
      this_local = *(LocationUpdater **)&pvVar4->second;
    }
    else {
      local_58[1] = 0;
      local_58[0] = 0;
      std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
                ((pair<unsigned_int,_unsigned_int> *)&this_local,local_58 + 1,local_58);
    }
  }
  return (OldToNew)this_local;
}

Assistant:

OldToNew getCompileUnitBasesForLoc(size_t offset) const {
    if (locToUnitMap.count(offset) == 0) {
      // There is no compile unit for this loc. It doesn't matter what we set
      // here.
      return OldToNew{0, 0};
    }
    auto index = locToUnitMap.at(offset);
    auto iter = compileUnitBases.find(index);
    if (iter != compileUnitBases.end()) {
      return iter->second;
    }
    return OldToNew{0, 0};
  }